

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pmt_tests.cpp
# Opt level: O2

void __thiscall pmt_tests::pmt_malleability::test_method(pmt_malleability *this)

{
  long lVar1;
  iterator in_R8;
  iterator in_R9;
  long in_FS_OFFSET;
  const_string msg;
  initializer_list<uint256> __l;
  initializer_list<bool> __l_00;
  const_string file;
  char *local_280;
  char *local_278;
  lazy_ostream local_270;
  undefined1 *local_260;
  char **local_258;
  assertion_result local_250;
  undefined1 *local_238;
  undefined1 *local_230;
  char *local_228;
  char *local_220;
  vector<unsigned_int,_std::allocator<unsigned_int>_> vIndex;
  vector<uint256,_std::allocator<uint256>_> vTxid;
  vector<bool,_std::allocator<bool>_> vMatch;
  base_blob<256U> local_1b8;
  CPartialMerkleTree tree;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  memcpy(&tree,&DAT_00bb69f0,0x180);
  __l._M_len = 0xc;
  __l._M_array = (iterator)&tree;
  std::vector<uint256,_std::allocator<uint256>_>::vector(&vTxid,__l,(allocator_type *)&vMatch);
  tree.nTransactions = 0;
  tree._4_4_ = 0;
  tree.vBits.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
  super__Bit_iterator_base._M_p._0_4_ = 0x10100;
  __l_00._M_len = 0xc;
  __l_00._M_array = (iterator)&tree;
  std::vector<bool,_std::allocator<bool>_>::vector(&vMatch,__l_00,(allocator_type *)&local_1b8);
  CPartialMerkleTree::CPartialMerkleTree(&tree,&vTxid,&vMatch);
  vIndex.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  vIndex.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  vIndex.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_228 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/pmt_tests.cpp"
  ;
  local_220 = "";
  local_238 = &boost::unit_test::basic_cstring<char_const>::null;
  local_230 = &boost::unit_test::basic_cstring<char_const>::null;
  msg.m_end = in_R9;
  msg.m_begin = in_R8;
  file.m_end = (iterator)0x7d;
  file.m_begin = (iterator)&local_228;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_238,msg);
  CPartialMerkleTree::ExtractMatches((uint256 *)&local_1b8,&tree,&vTxid,&vIndex);
  local_250.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)base_blob<256U>::IsNull(&local_1b8);
  local_250.m_message.px = (element_type *)0x0;
  local_250.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_258 = &local_280;
  local_280 = "tree.ExtractMatches(vTxid, vIndex).IsNull()";
  local_278 = "";
  local_270.m_empty = false;
  local_270._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_0113a070;
  local_260 = boost::unit_test::lazy_ostream::inst;
  boost::test_tools::tt_detail::report_assertion
            (&local_250,&local_270,1,0,WARN,0xbb688c,(size_t)&stack0xfffffffffffffd70,0x7d);
  boost::detail::shared_count::~shared_count(&local_250.m_message.pn);
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
            (&vIndex.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>);
  CPartialMerkleTree::~CPartialMerkleTree(&tree);
  std::_Bvector_base<std::allocator<bool>_>::~_Bvector_base
            (&vMatch.super__Bvector_base<std::allocator<bool>_>);
  std::_Vector_base<uint256,_std::allocator<uint256>_>::~_Vector_base
            (&vTxid.super__Vector_base<uint256,_std::allocator<uint256>_>);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

BOOST_AUTO_TEST_CASE(pmt_malleability)
{
    std::vector<uint256> vTxid{
        uint256{1}, uint256{2},
        uint256{3}, uint256{4},
        uint256{5}, uint256{6},
        uint256{7}, uint256{8},
        uint256{9}, uint256{10},
        uint256{9}, uint256{10},
    };
    std::vector<bool> vMatch = {false, false, false, false, false, false, false, false, false, true, true, false};

    CPartialMerkleTree tree(vTxid, vMatch);
    std::vector<unsigned int> vIndex;
    BOOST_CHECK(tree.ExtractMatches(vTxid, vIndex).IsNull());
}